

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O0

bool YAML::Utils::WriteComment(ostream_wrapper *out,string *str,size_t postCommentIndent)

{
  bool bVar1;
  ostream_wrapper *first;
  size_t in_RDX;
  ostream_wrapper *in_RDI;
  const_iterator i;
  int codePoint;
  size_t curIndent;
  ostream_wrapper *in_stack_ffffffffffffff98;
  ostream_wrapper *in_stack_ffffffffffffffa0;
  Indentation in_stack_ffffffffffffffb0;
  const_iterator in_stack_ffffffffffffffb8;
  int local_2c;
  Indentation local_28;
  size_t local_20;
  size_t local_18;
  ostream_wrapper *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_20 = ostream_wrapper::col(in_RDI);
  first = YAML::operator<<(in_stack_ffffffffffffffa0,(char (*) [2])in_stack_ffffffffffffff98);
  Indentation::Indentation(&local_28,local_18);
  YAML::operator<<(in_stack_ffffffffffffffa0,(Indentation *)in_stack_ffffffffffffff98);
  ostream_wrapper::set_comment(local_8);
  std::__cxx11::string::begin();
  while( true ) {
    std::__cxx11::string::end();
    bVar1 = anon_unknown_0::GetNextCodePointAndAdvance
                      ((int *)in_stack_ffffffffffffffb0.n,(const_iterator *)first,
                       in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    if (local_2c == 10) {
      in_stack_ffffffffffffff98 =
           YAML::operator<<(in_stack_ffffffffffffffa0,(char (*) [2])in_stack_ffffffffffffff98);
      IndentTo::IndentTo((IndentTo *)&stack0xffffffffffffffb8,local_20);
      YAML::operator<<(in_stack_ffffffffffffffa0,(IndentTo *)in_stack_ffffffffffffff98);
      in_stack_ffffffffffffffa0 =
           YAML::operator<<(in_stack_ffffffffffffffa0,(char (*) [2])in_stack_ffffffffffffff98);
      Indentation::Indentation((Indentation *)&stack0xffffffffffffffb0,local_18);
      YAML::operator<<(in_stack_ffffffffffffffa0,(Indentation *)in_stack_ffffffffffffff98);
      ostream_wrapper::set_comment(local_8);
    }
    else {
      anon_unknown_0::WriteCodePoint
                (in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    }
  }
  return true;
}

Assistant:

bool WriteComment(ostream_wrapper& out, const std::string& str,
                  std::size_t postCommentIndent) {
  const std::size_t curIndent = out.col();
  out << "#" << Indentation(postCommentIndent);
  out.set_comment();
  int codePoint;
  for (std::string::const_iterator i = str.begin();
       GetNextCodePointAndAdvance(codePoint, i, str.end());) {
    if (codePoint == '\n') {
      out << "\n"
          << IndentTo(curIndent) << "#" << Indentation(postCommentIndent);
      out.set_comment();
    } else {
      WriteCodePoint(out, codePoint);
    }
  }
  return true;
}